

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

double GetDynamicLengths(ZopfliLZ77Store *lz77,size_t lstart,size_t lend,uint *ll_lengths,
                        uint *d_lengths)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  uint *puVar6;
  byte bVar7;
  double dVar8;
  double dVar9;
  size_t d_counts [32];
  uint local_1838 [32];
  size_t d_counts2 [32];
  size_t ll_counts [288];
  uint ll_lengths2 [288];
  size_t ll_counts2 [288];
  
  bVar7 = 0;
  ZopfliLZ77GetHistogram(lz77,lstart,lend,ll_counts,d_counts);
  ll_counts[0x100] = 1;
  ZopfliCalculateBitLengths(ll_counts,0x120,0xf,ll_lengths);
  ZopfliCalculateBitLengths(d_counts,0x20,0xf,d_lengths);
  PatchDistanceCodesForBuggyDecoders(d_lengths);
  sVar1 = CalculateTreeSize(ll_lengths,d_lengths);
  sVar2 = CalculateBlockSymbolSizeGivenCounts
                    (ll_counts,d_counts,ll_lengths,d_lengths,lz77,lstart,lend);
  memcpy(ll_counts2,ll_counts,0x900);
  memcpy(d_counts2,d_counts,0x100);
  OptimizeHuffmanForRle(0x120,ll_counts2);
  OptimizeHuffmanForRle(0x20,d_counts2);
  ZopfliCalculateBitLengths(ll_counts2,0x120,0xf,ll_lengths2);
  ZopfliCalculateBitLengths(d_counts2,0x20,0xf,local_1838);
  PatchDistanceCodesForBuggyDecoders(local_1838);
  sVar3 = CalculateTreeSize(ll_lengths2,local_1838);
  sVar4 = CalculateBlockSymbolSizeGivenCounts
                    (ll_counts,d_counts,ll_lengths2,local_1838,lz77,lstart,lend);
  dVar8 = ((double)(sVar4 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
          (double)(sVar4 & 0xffffffff | 0x4330000000000000) +
          ((double)(sVar3 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
          (double)(sVar3 & 0xffffffff | 0x4330000000000000);
  dVar9 = ((double)(sVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
          (double)(sVar2 & 0xffffffff | 0x4330000000000000) +
          ((double)(sVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
          (double)(sVar1 & 0xffffffff | 0x4330000000000000);
  if (dVar8 < dVar9) {
    memcpy(ll_lengths,ll_lengths2,0x480);
    puVar6 = local_1838;
    for (lVar5 = 0x20; dVar9 = dVar8, lVar5 != 0; lVar5 = lVar5 + -1) {
      *d_lengths = *puVar6;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
      d_lengths = d_lengths + (ulong)bVar7 * -2 + 1;
    }
  }
  return dVar9;
}

Assistant:

static double GetDynamicLengths(const ZopfliLZ77Store* lz77,
                                size_t lstart, size_t lend,
                                unsigned* ll_lengths, unsigned* d_lengths) {
  size_t ll_counts[ZOPFLI_NUM_LL];
  size_t d_counts[ZOPFLI_NUM_D];

  ZopfliLZ77GetHistogram(lz77, lstart, lend, ll_counts, d_counts);
  ll_counts[256] = 1;  /* End symbol. */
  ZopfliCalculateBitLengths(ll_counts, ZOPFLI_NUM_LL, 15, ll_lengths);
  ZopfliCalculateBitLengths(d_counts, ZOPFLI_NUM_D, 15, d_lengths);
  PatchDistanceCodesForBuggyDecoders(d_lengths);
  return TryOptimizeHuffmanForRle(
      lz77, lstart, lend, ll_counts, d_counts, ll_lengths, d_lengths);
}